

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::SetMaximumPacketSize(RTPSession *this,size_t s)

{
  int status;
  size_t s_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else if (s < 600) {
    this_local._4_4_ = -0x3d;
  }
  else {
    this_local._4_4_ =
         (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1d])(this->rtptrans,s);
    if (-1 < this_local._4_4_) {
      this_local._4_4_ = RTPPacketBuilder::SetMaximumPacketSize(&this->packetbuilder,s);
      if (this_local._4_4_ < 0) {
        (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1d])
                  (this->rtptrans,this->maxpacksize);
      }
      else {
        this_local._4_4_ = RTCPPacketBuilder::SetMaximumPacketSize(&this->rtcpbuilder,s);
        if (this_local._4_4_ < 0) {
          RTPPacketBuilder::SetMaximumPacketSize(&this->packetbuilder,this->maxpacksize);
          (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1d])
                    (this->rtptrans,this->maxpacksize);
        }
        else {
          this->maxpacksize = s;
          this_local._4_4_ = 0;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SetMaximumPacketSize(size_t s)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	if (s < RTP_MINPACKETSIZE)
		return ERR_RTP_SESSION_MAXPACKETSIZETOOSMALL;
	
	int status;

	if ((status = rtptrans->SetMaximumPacketSize(s)) < 0)
		return status;

	BUILDER_LOCK
	if ((status = packetbuilder.SetMaximumPacketSize(s)) < 0)
	{
		BUILDER_UNLOCK
		// restore previous max packet size
		rtptrans->SetMaximumPacketSize(maxpacksize);
		return status;
	}
	if ((status = rtcpbuilder.SetMaximumPacketSize(s)) < 0)
	{
		// restore previous max packet size
		packetbuilder.SetMaximumPacketSize(maxpacksize);
		BUILDER_UNLOCK
		rtptrans->SetMaximumPacketSize(maxpacksize);
		return status;
	}
	BUILDER_UNLOCK
	maxpacksize = s;
	return 0;
}